

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aixlog.hpp
# Opt level: O0

string * AixLog::to_string_abi_cxx11_(Severity logSeverity)

{
  char in_SIL;
  string *in_RDI;
  stringstream ss;
  allocator<char> *in_stack_fffffffffffffe30;
  allocator<char> *__a;
  string *psVar1;
  stringstream local_1b0 [16];
  undefined1 local_1a0 [382];
  allocator<char> local_22;
  allocator<char> local_21;
  allocator<char> local_20;
  allocator<char> local_1f;
  allocator<char> local_1e;
  allocator<char> local_1d [19];
  allocator<char> local_a;
  char local_9;
  
  psVar1 = in_RDI;
  switch(in_SIL) {
  case '\0':
    __a = &local_a;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>(psVar1,(char *)in_RDI,__a);
    std::allocator<char>::~allocator(&local_a);
    break;
  case '\x01':
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar1,(char *)in_RDI,in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(local_1d);
    break;
  case '\x02':
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar1,(char *)in_RDI,in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(&local_1e);
    break;
  case '\x03':
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar1,(char *)in_RDI,in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(&local_1f);
    break;
  case '\x04':
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar1,(char *)in_RDI,in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(&local_20);
    break;
  case '\x05':
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar1,(char *)in_RDI,in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(&local_21);
    break;
  case '\x06':
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              (psVar1,(char *)in_RDI,in_stack_fffffffffffffe30);
    std::allocator<char>::~allocator(&local_22);
    break;
  default:
    local_9 = in_SIL;
    std::__cxx11::stringstream::stringstream(local_1b0);
    std::ostream::operator<<(local_1a0,(int)local_9);
    std::__cxx11::stringstream::str();
    std::__cxx11::stringstream::~stringstream(local_1b0);
    psVar1 = in_RDI;
  }
  return psVar1;
}

Assistant:

static std::string to_string(Severity logSeverity) {
  switch (logSeverity) {
    case Severity::trace:
      return "Trace";
    case Severity::debug:
      return "Debug";
    case Severity::info:
      return "Info";
    case Severity::notice:
      return "Notice";
    case Severity::warning:
      return "Warn";
    case Severity::error:
      return "Error";
    case Severity::fatal:
      return "Fatal";
    default:
      std::stringstream ss;
      ss << static_cast<int>(logSeverity);
      return ss.str();
  }
}